

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

bool __thiscall
pybind11::detail::argument_loader<DistanceGraph_const*,int,float,float,bool>::
load_impl_sequence<0ul,1ul,2ul,3ul,4ul>
          (argument_loader<DistanceGraph_const*,int,float,float,bool> *this,long call)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  handle hVar1;
  long lVar2;
  bool bVar3;
  undefined8 in_RAX;
  long lVar4;
  reference rVar5;
  undefined8 uStack_38;
  
  hVar1.m_ptr = (PyObject *)**(undefined8 **)(call + 8);
  this_00 = (vector<bool,_std::allocator<bool>_> *)(call + 0x20);
  uStack_38 = in_RAX;
  rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,0);
  bVar3 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                    ((type_caster_generic *)(this + 0x10),hVar1,(*rVar5._M_p & rVar5._M_mask) != 0);
  uStack_38._0_4_ = CONCAT13(bVar3,(undefined3)uStack_38);
  hVar1.m_ptr = *(PyObject **)(*(long *)(call + 8) + 8);
  rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,1);
  bVar3 = type_caster<int,_void>::load
                    ((type_caster<int,_void> *)(this + 0xc),hVar1,(*rVar5._M_p & rVar5._M_mask) != 0
                    );
  uStack_38._0_5_ = CONCAT14(bVar3,(undefined4)uStack_38);
  hVar1.m_ptr = *(PyObject **)(*(long *)(call + 8) + 0x10);
  rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,2);
  bVar3 = type_caster<float,_void>::load
                    ((type_caster<float,_void> *)(this + 8),hVar1,(*rVar5._M_p & rVar5._M_mask) != 0
                    );
  uStack_38._0_6_ = CONCAT15(bVar3,(undefined5)uStack_38);
  hVar1.m_ptr = *(PyObject **)(*(long *)(call + 8) + 0x18);
  rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,3);
  bVar3 = type_caster<float,_void>::load
                    ((type_caster<float,_void> *)(this + 4),hVar1,(*rVar5._M_p & rVar5._M_mask) != 0
                    );
  uStack_38._0_7_ = CONCAT16(bVar3,(undefined6)uStack_38);
  hVar1.m_ptr = *(PyObject **)(*(long *)(call + 8) + 0x20);
  rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,4);
  type_caster<bool,_void>::load
            ((type_caster<bool,_void> *)this,hVar1,(*rVar5._M_p & rVar5._M_mask) != 0);
  lVar2 = 0;
  do {
    lVar4 = lVar2;
    if (lVar4 == 5) break;
    lVar2 = lVar4 + 1;
  } while (*(char *)((long)&uStack_38 + lVar4 + 3) != '\0');
  return lVar4 == 5;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }